

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O2

void mbhit(monst *mon,int range,_func_int_monst_ptr_obj_ptr *fhitm,_func_int_obj_ptr_obj_ptr *fhito,
          obj *obj)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar6;
  obj *poVar7;
  byte bVar8;
  int iVar9;
  monst *worm;
  char cVar10;
  int y;
  int x;
  undefined8 local_40;
  undefined8 local_38;
  
  bhitpos.x = mon->mx;
  bhitpos.y = mon->my;
  iVar3 = sgn((int)mon->mux - (int)bhitpos.x);
  local_38 = CONCAT44(extraout_var,iVar3);
  iVar3 = sgn((int)mon->muy - (int)mon->my);
  local_40 = CONCAT44(extraout_var_00,iVar3);
  do {
    if (range < 1) {
      return;
    }
    cVar10 = bhitpos.x + (char)local_38;
    bVar8 = (char)local_40 + bhitpos.y;
    x = (int)cVar10;
    y = (int)(char)bVar8;
    if (0x4e < (byte)(cVar10 - 1U)) {
      return;
    }
    if (0x14 < bVar8) {
      return;
    }
    bhitpos.x = cVar10;
    bhitpos.y = bVar8;
    bVar2 = find_drawbridge(&x,&y);
    if (((bVar2 != '\0') && (*(short *)(fhitm + 0x2a) == 0x1c4)) &&
       (level->locations[bhitpos.x][bhitpos.y].typ == '\f')) {
      destroy_drawbridge(x,y);
      if (mon->wormno == '\0') {
        if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_001ed636;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ed5d7;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ed5ce;
        }
        else {
LAB_001ed5ce:
          if (ublindf == (obj *)0x0) goto LAB_001ed692;
LAB_001ed5d7:
          if (ublindf->oartifact != '\x1d') goto LAB_001ed692;
        }
        if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[mon->my][mon->mx] & 1U) == 0 || ((mon->data->mflags3 & 0x200) == 0))))
        goto LAB_001ed692;
      }
      else {
        bVar2 = worm_known(level,mon);
        if (bVar2 == '\0') goto LAB_001ed692;
      }
LAB_001ed636:
      uVar5 = *(uint *)&mon->field_0x60;
      if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar5 & 0x280) == 0) goto LAB_001ed679;
      }
      else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ed679:
        if ((u._1052_1_ & 0x20) == 0) {
          discover_object((int)*(short *)(fhitm + 0x2a),'\x01','\x01');
        }
      }
    }
LAB_001ed692:
    if ((bhitpos.x == u.ux) && (worm = &youmonst, bhitpos.y == u.uy)) {
LAB_001ed6ae:
      mbhitm(worm,(obj *)fhitm);
      iVar3 = range + -4;
    }
    else {
      iVar3 = range + -1;
      worm = level->monsters[bhitpos.x][bhitpos.y];
      if ((worm != (monst *)0x0) && (uVar5 = *(uint *)&worm->field_0x60, (uVar5 >> 9 & 1) == 0)) {
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) goto LAB_001ed6ae;
        if (worm->wormno == '\0') {
          if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001eda4c;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ed888;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ed87f;
          }
          else {
LAB_001ed87f:
            if (ublindf == (obj *)0x0) goto LAB_001eda9a;
LAB_001ed888:
            if (ublindf->oartifact != '\x1d') goto LAB_001eda9a;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((worm->data->mflags3 & 0x200) != 0))
          goto LAB_001eda4c;
        }
        else {
          bVar2 = worm_known(level,worm);
          if (bVar2 != '\0') {
            uVar5 = *(uint *)&worm->field_0x60;
LAB_001eda4c:
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) == 0) goto LAB_001eda8b;
            }
            else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001eda8b:
              if ((u._1052_1_ & 0x20) == 0) goto LAB_001ed6ae;
            }
          }
        }
LAB_001eda9a:
        if (((worm->data->mflags1 & 0x10000) == 0) &&
           ((poVar7 = which_armor(worm,4), poVar7 == (obj *)0x0 ||
            (poVar7 = which_armor(worm,4), poVar7->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001edae8;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001edae3;
          }
          else {
LAB_001edae3:
            if (ublindf != (obj *)0x0) {
LAB_001edae8:
              if (ublindf->oartifact == '\x1d') goto LAB_001edb7d;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001ed6ae;
          }
LAB_001edb7d:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar3 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
          goto LAB_001ed6ae;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(worm), bVar2 == '\0')))) {
          map_invisible(bhitpos.x,bhitpos.y);
        }
        goto LAB_001ed6ae;
      }
    }
    iVar9 = 0;
    poVar7 = level->objects[bhitpos.x][bhitpos.y];
    while (poVar7 != (obj *)0x0) {
      poVar1 = (poVar7->v).v_nexthere;
      iVar4 = bhito(poVar7,(obj *)fhitm);
      iVar9 = iVar9 + iVar4;
      poVar7 = poVar1;
    }
    range = iVar3 + -1 + (uint)(iVar9 == 0);
    bVar8 = level->locations[bhitpos.x][bhitpos.y].typ;
    if ((((bVar8 == 0x17) || (bVar8 == 0xf)) && (*(ushort *)(fhitm + 0x2a) - 0x1c4 < 10)) &&
       (((0x301U >> (*(ushort *)(fhitm + 0x2a) - 0x1c4 & 0x1f) & 1) != 0 &&
        (bVar2 = doorlock((obj *)fhitm,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')))) {
      if (mon->wormno == '\0') {
        if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_001ed8ee;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ed841;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ed838;
        }
        else {
LAB_001ed838:
          if (ublindf == (obj *)0x0) goto LAB_001ed959;
LAB_001ed841:
          if (ublindf->oartifact != '\x1d') goto LAB_001ed959;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mon->my][mon->mx] & 1U) != 0)
            ) && ((mon->data->mflags3 & 0x200) != 0)) goto LAB_001ed8ee;
      }
      else {
        bVar2 = worm_known(level,mon);
        if (bVar2 != '\0') {
LAB_001ed8ee:
          uVar5 = *(uint *)&mon->field_0x60;
          if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar5 & 0x280) == 0) goto LAB_001ed93b;
          }
          else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ed93b:
            if ((u._1052_1_ & 0x20) == 0) {
              discover_object((int)*(short *)(fhitm + 0x2a),'\x01','\x01');
            }
          }
        }
      }
LAB_001ed959:
      if (((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0x1f0) == 0x10) &&
         (pcVar6 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar6 != '\0')) {
        add_damage(bhitpos.x,bhitpos.y,0);
      }
    }
    if ((bVar8 < 0x11) ||
       ((bVar8 == 0x17 && ((level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0xc0) != 0)))) {
      bhitpos.y = bhitpos.y - (char)local_40;
      bhitpos.x = bhitpos.x - (char)local_38;
      return;
    }
  } while( true );
}

Assistant:

static void mbhit(struct monst *mon,	/* monster shooting the wand */
		  int range,		/* direction and range */
		  int (*fhitm)(struct monst*,struct obj*),
		  int (*fhito)(struct obj*,struct obj*), /* fns called when mon/obj hit */
		  struct obj *obj)	/* 2nd arg to fhitm/fhito */
{
	struct monst *mtmp;
	struct obj *otmp;
	uchar typ;
	int ddx, ddy;

	bhitpos.x = mon->mx;
	bhitpos.y = mon->my;
	ddx = sgn(mon->mux - mon->mx);
	ddy = sgn(mon->muy - mon->my);

	while (range-- > 0) {
		int x,y;

		bhitpos.x += ddx;
		bhitpos.y += ddy;
		x = bhitpos.x; y = bhitpos.y;

		if (!isok(x,y)) {
		    bhitpos.x -= ddx;
		    bhitpos.y -= ddy;
		    break;
		}
		if (find_drawbridge(&x,&y)) {
		    switch (obj->otyp) {
			case WAN_STRIKING:
			    /* destroy closed drawbridges, not open ones */
			    if (level->locations[bhitpos.x][bhitpos.y].typ == DBWALL) {
				destroy_drawbridge(x,y);
				if (canseemon(level, mon))
				    makeknown(obj->otyp);
			    }
			    break;
		    }
		}
		if (bhitpos.x==u.ux && bhitpos.y==u.uy) {
			(*fhitm)(&youmonst, obj);
			range -= 3;
		} else if (MON_AT(level, bhitpos.x, bhitpos.y)){
			mtmp = m_at(level, bhitpos.x, bhitpos.y);
			if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp))
			    map_invisible(bhitpos.x, bhitpos.y);
			(*fhitm)(mtmp, obj);
			range -= 3;
		}
		/* modified by GAN to hit all objects */
		if (fhito){
		    int hitanything = 0;
		    struct obj *next_obj;

		    for (otmp = level->objects[bhitpos.x][bhitpos.y];
							otmp; otmp = next_obj) {
			/* Fix for polymorph bug, Tim Wright */
			next_obj = otmp->nexthere;
			hitanything += (*fhito)(otmp, obj);
		    }
		    if (hitanything)	range--;
		}
		typ = level->locations[bhitpos.x][bhitpos.y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) {
		    switch (obj->otyp) {
			/* note: monsters don't use opening or locking magic
			   at present, but keep these as placeholders */
			case WAN_OPENING:
			case WAN_LOCKING:
			case WAN_STRIKING:
			    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
				if (canseemon(level, mon))
				    makeknown(obj->otyp);
				/* if a shop door gets broken, add it to
				   the shk's fix list (no cost to player) */
				if (level->locations[bhitpos.x][bhitpos.y].doormask ==
					D_BROKEN &&
				    *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE))
				    add_damage(bhitpos.x, bhitpos.y, 0L);
			    }
			    break;
		    }
		}
		if (!ZAP_POS(typ) || (IS_DOOR(typ) &&
		   (level->locations[bhitpos.x][bhitpos.y].doormask & (D_LOCKED | D_CLOSED)))
		  ) {
			bhitpos.x -= ddx;
			bhitpos.y -= ddy;
			break;
		}
	}
}